

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ulist.cpp
# Opt level: O3

UBool ulist_containsString_63(UList *list,char *data,int32_t length)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  UListNode *pUVar3;
  
  if (list == (UList *)0x0) {
    return '\0';
  }
  pUVar3 = list->head;
  if (pUVar3 != (UListNode *)0x0) {
    do {
      __s = (char *)pUVar3->data;
      sVar2 = strlen(__s);
      if (((int)sVar2 == length) && (iVar1 = bcmp(data,__s,(long)length), iVar1 == 0)) {
        return '\x01';
      }
      pUVar3 = pUVar3->next;
    } while (pUVar3 != (UListNode *)0x0);
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2 ulist_containsString(const UList *list, const char *data, int32_t length) {
    if (list != NULL) {
        const UListNode *pointer;
        for (pointer = list->head; pointer != NULL; pointer = pointer->next) {
            if (length == (int32_t)uprv_strlen((const char *)pointer->data)) {
                if (uprv_memcmp(data, pointer->data, length) == 0) {
                    return TRUE;
                }
            }
        }
    }
    return FALSE;
}